

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
          (SourceTreeDescriptorDatabase *this,SourceTree *source_tree)

{
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__SourceTreeDescriptorDatabase_00424290;
  this->source_tree_ = source_tree;
  this->error_collector_ = (MultiFileErrorCollector *)0x0;
  this->using_validation_error_collector_ = false;
  SourceLocationTable::SourceLocationTable(&this->source_locations_);
  ValidationErrorCollector::ValidationErrorCollector(&this->validation_error_collector_,this);
  return;
}

Assistant:

SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase(
    SourceTree* source_tree)
  : source_tree_(source_tree),
    error_collector_(NULL),
    using_validation_error_collector_(false),
    validation_error_collector_(this) {}